

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void anon_unknown.dwarf_8445c::AssertInt16Fails(char *s)

{
  size_t sVar1;
  Message *pMVar2;
  char *pcVar3;
  uint16_t actual;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  char *s_local;
  AssertionResult gtest_ar;
  
  s_local = s;
  sVar1 = strlen(s);
  local_40.ptr_._0_4_ = 1;
  local_38.data_._0_4_ = wabt::ParseInt16(s,s + sVar1,&actual,SignedAndUnsigned);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&gtest_ar,"Result::Error",
             "ParseInt16(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_40,
             (Result *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    pMVar2 = testing::Message::operator<<((Message *)&local_40,&s_local);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_40.ptr_._0_4_ = 1;
    local_38.data_._0_4_ = wabt::ParseInt16(s_local,s + sVar1,&actual,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              ((internal *)&gtest_ar,"Result::Error",
               "ParseInt16(s, end, &actual, ParseIntType::UnsignedOnly)",(Enum *)&local_40,
               (Result *)&local_38);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      pMVar2 = testing::Message::operator<<((Message *)&local_40,&s_local);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
                 ,0x74,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_40);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void AssertInt16Fails(const char* s) {
  const char* const end = s + strlen(s);
  uint16_t actual;
  ASSERT_EQ(Result::Error,
            ParseInt16(s, end, &actual, ParseIntType::SignedAndUnsigned))
      << s;
  ASSERT_EQ(Result::Error,
            ParseInt16(s, end, &actual, ParseIntType::UnsignedOnly))
      << s;
}